

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

sftp_request * sftp_alloc_request(void)

{
  void *pvVar1;
  int local_24;
  sftp_request *psStack_20;
  uint i;
  sftp_request *r;
  int tsize;
  uint mid;
  uint high;
  uint low;
  
  if (sftp_requests == (tree234 *)0x0) {
    sftp_requests = newtree234(sftp_reqcmp);
  }
  r._0_4_ = count234(sftp_requests);
  mid = 0xffffffff;
  tsize = (int)r;
  while (1 < tsize - mid) {
    r._4_4_ = tsize + mid >> 1;
    psStack_20 = (sftp_request *)index234(sftp_requests,r._4_4_);
    if (*(int *)psStack_20 == r._4_4_ + 0x100) {
      mid = r._4_4_;
    }
    else {
      tsize = r._4_4_;
    }
  }
  local_24 = mid + 0x101;
  pvVar1 = find234(sftp_requests,&local_24,sftp_reqfind);
  if (pvVar1 != (void *)0x0) {
    __assert_fail("NULL == find234(sftp_requests, &i, sftp_reqfind)",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/sftp.c",
                  0x88,"struct sftp_request *sftp_alloc_request(void)");
  }
  psStack_20 = (sftp_request *)safemalloc(1,0x10,0);
  psStack_20->id = mid + 0x101;
  psStack_20->registered = false;
  psStack_20->userdata = (void *)0x0;
  add234(sftp_requests,psStack_20);
  return psStack_20;
}

Assistant:

static struct sftp_request *sftp_alloc_request(void)
{
    unsigned low, high, mid;
    int tsize;
    struct sftp_request *r;

    if (sftp_requests == NULL)
        sftp_requests = newtree234(sftp_reqcmp);

    /*
     * First-fit allocation of request IDs: always pick the lowest
     * unused one. To do this, binary-search using the counted
     * B-tree to find the largest ID which is in a contiguous
     * sequence from the beginning. (Precisely everything in that
     * sequence must have ID equal to its tree index plus
     * REQUEST_ID_OFFSET.)
     */
    tsize = count234(sftp_requests);

    low = -1;
    high = tsize;
    while (high - low > 1) {
        mid = (high + low) / 2;
        r = index234(sftp_requests, mid);
        if (r->id == mid + REQUEST_ID_OFFSET)
            low = mid;                 /* this one is fine */
        else
            high = mid;                /* this one is past it */
    }
    /*
     * Now low points to either -1, or the tree index of the
     * largest ID in the initial sequence.
     */
    {
        unsigned i = low + 1 + REQUEST_ID_OFFSET;
        assert(NULL == find234(sftp_requests, &i, sftp_reqfind));
    }

    /*
     * So the request ID we need to create is
     * low + 1 + REQUEST_ID_OFFSET.
     */
    r = snew(struct sftp_request);
    r->id = low + 1 + REQUEST_ID_OFFSET;
    r->registered = false;
    r->userdata = NULL;
    add234(sftp_requests, r);
    return r;
}